

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMFImporter_Postprocess.cpp
# Opt level: O2

void __thiscall Assimp::AMFImporter::Postprocess_BuildScene(AMFImporter *this,aiScene *pScene)

{
  _List_node_base *p_Var1;
  list<Assimp::AMFImporter::SPP_Texture,_std::allocator<Assimp::AMFImporter::SPP_Texture>_> *plVar2;
  EType EVar3;
  size_t i;
  aiNode *paVar4;
  aiNode *paVar5;
  aiNode **ppaVar6;
  ulong uVar7;
  aiMesh **ppaVar8;
  aiTexture **ppaVar9;
  undefined8 *puVar10;
  aiMaterial **ppaVar11;
  aiMaterial *this_00;
  DeadlyImportError *this_01;
  _List_node_base *p_Var12;
  long *plVar13;
  uint uVar14;
  size_t sVar15;
  long *plVar16;
  const_iterator __position;
  long lVar17;
  size_t __n;
  const_iterator nl_it;
  const_iterator cVar18;
  unsigned_long value;
  iterator __end2;
  list<aiNode_*,_std::allocator<aiNode_*>_> node_list;
  list<aiMesh_*,_std::allocator<aiMesh_*>_> mesh_list;
  int mode;
  char acStack_48c [4];
  ulong local_488;
  list<CAMFImporter_NodeElement_Metadata_*,_std::allocator<CAMFImporter_NodeElement_Metadata_*>_>
  meta_list;
  int repeat;
  aiNode *tnode;
  
  node_list.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&node_list;
  node_list.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node._M_size = 0;
  mesh_list.super__List_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&mesh_list;
  mesh_list.super__List_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl._M_node._M_size = 0;
  meta_list.
  super__List_base<CAMFImporter_NodeElement_Metadata_*,_std::allocator<CAMFImporter_NodeElement_Metadata_*>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&meta_list;
  meta_list.
  super__List_base<CAMFImporter_NodeElement_Metadata_*,_std::allocator<CAMFImporter_NodeElement_Metadata_*>_>
  ._M_impl._M_node._M_size = 0;
  node_list.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node.
  super__List_node_base._M_prev =
       node_list.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node.
       super__List_node_base._M_next;
  mesh_list.super__List_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl._M_node.
  super__List_node_base._M_prev =
       mesh_list.super__List_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl._M_node.
       super__List_node_base._M_next;
  meta_list.
  super__List_base<CAMFImporter_NodeElement_Metadata_*,_std::allocator<CAMFImporter_NodeElement_Metadata_*>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       meta_list.
       super__List_base<CAMFImporter_NodeElement_Metadata_*,_std::allocator<CAMFImporter_NodeElement_Metadata_*>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  paVar4 = (aiNode *)operator_new(0x478);
  paVar5 = paVar4;
  aiNode::aiNode(paVar4);
  pScene->mRootNode = paVar4;
  paVar4->mParent = (aiNode *)0x0;
  *(byte *)&pScene->mFlags = (byte)pScene->mFlags | 0x20;
  p_Var12 = (_List_node_base *)&this->mNodeElement_List;
  do {
    p_Var12 = (((_List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>
                 *)&p_Var12->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    if (p_Var12 == (_List_node_base *)&this->mNodeElement_List) {
      this_01 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string
                ((string *)&tnode,"Root(<amf>) element not found.",(allocator *)&mode);
      DeadlyImportError::DeadlyImportError(this_01,(string *)&tnode);
      __cxa_throw(this_01,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
  } while (*(int *)((long)p_Var12[1]._M_next + 8) != 9);
  plVar13 = (long *)((long)p_Var12[1]._M_next + 0x38);
  plVar16 = plVar13;
  while (plVar16 = (long *)*plVar16, plVar16 != plVar13) {
    if ((((CAMFImporter_NodeElement_Material *)plVar16[2])->super_CAMFImporter_NodeElement).Type ==
        ENET_Material) {
      paVar5 = (aiNode *)this;
      Postprocess_BuildMaterial(this,(CAMFImporter_NodeElement_Material *)plVar16[2]);
    }
  }
  plVar16 = plVar13;
  while (plVar16 = (long *)*plVar16, plVar16 != plVar13) {
    if ((((CAMFImporter_NodeElement_Object *)plVar16[2])->super_CAMFImporter_NodeElement).Type ==
        ENET_Object) {
      tnode = (aiNode *)0x0;
      paVar5 = (aiNode *)this;
      Postprocess_BuildNodeAndObject
                (this,(CAMFImporter_NodeElement_Object *)plVar16[2],&mesh_list,&tnode);
      if (tnode != (aiNode *)0x0) {
        paVar5 = (aiNode *)&node_list;
        std::__cxx11::list<aiNode_*,_std::allocator<aiNode_*>_>::push_back(&node_list,&tnode);
      }
    }
  }
  plVar16 = plVar13;
  while (plVar16 = (long *)*plVar16, plVar16 != plVar13) {
    paVar4 = (aiNode *)plVar16[2];
    EVar3 = *(EType *)((paVar4->mName).data + 4);
    if (EVar3 == ENET_Constellation) {
      paVar5 = (aiNode *)this;
      Postprocess_BuildConstellation
                (this,(CAMFImporter_NodeElement_Constellation *)paVar4,&node_list);
      EVar3 = *(EType *)((paVar4->mName).data + 4);
    }
    if (EVar3 == ENET_Metadata) {
      paVar5 = (aiNode *)&meta_list;
      tnode = paVar4;
      std::__cxx11::
      list<CAMFImporter_NodeElement_Metadata_*,_std::allocator<CAMFImporter_NodeElement_Metadata_*>_>
      ::push_back(&meta_list,(value_type *)&tnode);
    }
  }
  Postprocess_AddMetadata((AMFImporter *)paVar5,&meta_list,pScene->mRootNode);
LAB_003d0fd9:
  __position._M_node = (_List_node_base *)&node_list;
  if (1 < node_list.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node._M_size) {
    while (__position._M_node =
                (((_List_base<aiNode_*,_std::allocator<aiNode_*>_> *)&(__position._M_node)->_M_next)
                ->_M_impl)._M_node.super__List_node_base._M_next,
          cVar18._M_node = __position._M_node, __position._M_node != (_List_node_base *)&node_list)
    {
      while (cVar18._M_node =
                  (((_List_base<aiNode_*,_std::allocator<aiNode_*>_> *)&(cVar18._M_node)->_M_next)->
                  _M_impl)._M_node.super__List_node_base._M_next,
            cVar18._M_node != (_List_node_base *)&node_list) {
        paVar5 = aiNode::FindNode((aiNode *)cVar18._M_node[1]._M_next,
                                  (char *)((long)&(__position._M_node[1]._M_next)->_M_next + 4));
        if (paVar5 != (aiNode *)0x0) {
          std::__cxx11::list<aiNode_*,_std::allocator<aiNode_*>_>::erase(&node_list,__position);
          goto LAB_003d0fd9;
        }
      }
    }
  }
  p_Var12 = node_list.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node.
            super__List_node_base._M_next;
  if (node_list.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node.
      super__List_node_base._M_next != (_List_node_base *)&node_list) {
    pScene->mRootNode->mNumChildren =
         (uint)node_list.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node.
               _M_size;
    paVar5 = pScene->mRootNode;
    ppaVar6 = (aiNode **)operator_new__((ulong)paVar5->mNumChildren << 3);
    paVar5->mChildren = ppaVar6;
    for (uVar7 = 0; uVar7 < pScene->mRootNode->mNumChildren; uVar7 = uVar7 + 1) {
      p_Var12[1]._M_next[0x44]._M_prev = (_List_node_base *)pScene->mRootNode;
      p_Var1 = p_Var12 + 1;
      p_Var12 = p_Var12->_M_next;
      pScene->mRootNode->mChildren[uVar7] = (aiNode *)p_Var1->_M_next;
    }
  }
  sVar15 = mesh_list.super__List_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl._M_node._M_size;
  p_Var12 = mesh_list.super__List_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl._M_node.
            super__List_node_base._M_next;
  if (mesh_list.super__List_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl._M_node.
      super__List_node_base._M_next != (_List_node_base *)&mesh_list) {
    pScene->mNumMeshes =
         (uint)mesh_list.super__List_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl._M_node.
               _M_size;
    ppaVar8 = (aiMesh **)
              operator_new__((mesh_list.super__List_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                              _M_impl._M_node._M_size & 0xffffffff) << 3);
    pScene->mMeshes = ppaVar8;
    for (uVar7 = 0; uVar7 < (sVar15 & 0xffffffff); uVar7 = uVar7 + 1) {
      p_Var1 = p_Var12 + 1;
      p_Var12 = p_Var12->_M_next;
      pScene->mMeshes[uVar7] = (aiMesh *)p_Var1->_M_next;
      sVar15 = (size_t)pScene->mNumMeshes;
    }
  }
  uVar7 = (this->mTexture_Converted).
          super__List_base<Assimp::AMFImporter::SPP_Texture,_std::allocator<Assimp::AMFImporter::SPP_Texture>_>
          ._M_impl._M_node._M_size;
  uVar14 = (uint)uVar7;
  pScene->mNumTextures = uVar14;
  if (uVar14 != 0) {
    ppaVar9 = (aiTexture **)operator_new__((uVar7 & 0xffffffff) << 3);
    plVar2 = &this->mTexture_Converted;
    pScene->mTextures = ppaVar9;
    lVar17 = 0;
    p_Var12 = (_List_node_base *)plVar2;
    while (p_Var12 = (((_List_base<Assimp::AMFImporter::SPP_Texture,_std::allocator<Assimp::AMFImporter::SPP_Texture>_>
                        *)&p_Var12->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
          p_Var12 != (_List_node_base *)plVar2) {
      puVar10 = (undefined8 *)operator_new(0x428);
      *puVar10 = 0;
      puVar10[3] = 0;
      *(undefined4 *)(puVar10 + 4) = 0;
      *(undefined1 *)((long)puVar10 + 0x24) = 0;
      memset((void *)((long)puVar10 + 0x25),0x1b,0x3ff);
      *(undefined4 *)(puVar10 + 1) = 0;
      *(undefined8 **)((long)pScene->mTextures + lVar17) = puVar10;
      **(undefined4 **)((long)pScene->mTextures + lVar17) = *(undefined4 *)&p_Var12[3]._M_next;
      *(undefined4 *)(*(long *)((long)pScene->mTextures + lVar17) + 4) =
           *(undefined4 *)&p_Var12[3]._M_prev;
      *(_List_node_base **)(*(long *)((long)pScene->mTextures + lVar17) + 0x18) = p_Var12[5]._M_prev
      ;
      strcpy((char *)(*(long *)((long)pScene->mTextures + lVar17) + 8),
             (char *)((long)&p_Var12[4]._M_prev + 1));
      lVar17 = lVar17 + 8;
    }
    uVar7 = (this->mTexture_Converted).
            super__List_base<Assimp::AMFImporter::SPP_Texture,_std::allocator<Assimp::AMFImporter::SPP_Texture>_>
            ._M_impl._M_node._M_size;
    pScene->mNumMaterials = (uint)uVar7;
    ppaVar11 = (aiMaterial **)operator_new__((uVar7 & 0xffffffff) << 3);
    pScene->mMaterials = ppaVar11;
    value = 0;
    p_Var12 = (_List_node_base *)plVar2;
    while( true ) {
      p_Var12 = (((_List_base<Assimp::AMFImporter::SPP_Texture,_std::allocator<Assimp::AMFImporter::SPP_Texture>_>
                   *)&p_Var12->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
      if (p_Var12 == (_List_node_base *)plVar2) break;
      to_string<unsigned_long>((string *)&repeat,value);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&mode,"*",
                     (string *)&repeat);
      __n = local_488 & 0xffffffff;
      if ((local_488 & 0xfffffc00) != 0) {
        __n = 0x3ff;
      }
      tnode = (aiNode *)CONCAT44(tnode._4_4_,(int)__n);
      memcpy((void *)((long)&tnode + 4),(void *)CONCAT44(acStack_48c,mode),__n);
      *(undefined1 *)((long)&tnode + __n + 4) = 0;
      std::__cxx11::string::~string((string *)&mode);
      std::__cxx11::string::~string((string *)&repeat);
      mode = 0;
      repeat = (int)*(byte *)&p_Var12[4]._M_prev;
      this_00 = (aiMaterial *)operator_new(0x10);
      aiMaterial::aiMaterial(this_00);
      pScene->mMaterials[value] = this_00;
      aiMaterial::AddProperty(pScene->mMaterials[value],(aiString *)&tnode,"$tex.file",1,0);
      aiMaterial::AddProperty(pScene->mMaterials[value],&mode,1,"$tex.op",1,0);
      aiMaterial::AddProperty(pScene->mMaterials[value],&repeat,1,"$tex.mapmodeu",1,0);
      aiMaterial::AddProperty(pScene->mMaterials[value],&repeat,1,"$tex.mapmodev",1,0);
      value = value + 1;
    }
  }
  std::__cxx11::
  _List_base<CAMFImporter_NodeElement_Metadata_*,_std::allocator<CAMFImporter_NodeElement_Metadata_*>_>
  ::_M_clear(&meta_list.
              super__List_base<CAMFImporter_NodeElement_Metadata_*,_std::allocator<CAMFImporter_NodeElement_Metadata_*>_>
            );
  std::__cxx11::_List_base<aiMesh_*,_std::allocator<aiMesh_*>_>::_M_clear
            (&mesh_list.super__List_base<aiMesh_*,_std::allocator<aiMesh_*>_>);
  std::__cxx11::_List_base<aiNode_*,_std::allocator<aiNode_*>_>::_M_clear
            (&node_list.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>);
  return;
}

Assistant:

void AMFImporter::Postprocess_BuildScene(aiScene* pScene)
{
std::list<aiNode*> node_list;
std::list<aiMesh*> mesh_list;
std::list<CAMFImporter_NodeElement_Metadata*> meta_list;

	//
	// Because for AMF "material" is just complex colors mixing so aiMaterial will not be used.
	// For building aiScene we are must to do few steps:
	// at first creating root node for aiScene.
	pScene->mRootNode = new aiNode;
	pScene->mRootNode->mParent = nullptr;
	pScene->mFlags |= AI_SCENE_FLAGS_ALLOW_SHARED;
	// search for root(<amf>) element
	CAMFImporter_NodeElement* root_el = nullptr;

	for(CAMFImporter_NodeElement* ne: mNodeElement_List)
	{
		if(ne->Type != CAMFImporter_NodeElement::ENET_Root) continue;

		root_el = ne;

		break;
	}// for(const CAMFImporter_NodeElement* ne: mNodeElement_List)

	// Check if root element are found.
	if(root_el == nullptr) throw DeadlyImportError("Root(<amf>) element not found.");

	// after that walk through children of root and collect data. Five types of nodes can be placed at top level - in <amf>: <object>, <material>, <texture>,
	// <constellation> and <metadata>. But at first we must read <material> and <texture> because they will be used in <object>. <metadata> can be read
	// at any moment.
	//
	// 1. <material>
	// 2. <texture> will be converted later when processing triangles list. \sa Postprocess_BuildMeshSet
	for(const CAMFImporter_NodeElement* root_child: root_el->Child)
	{
		if(root_child->Type == CAMFImporter_NodeElement::ENET_Material) Postprocess_BuildMaterial(*((CAMFImporter_NodeElement_Material*)root_child));
	}

	// After "appearance" nodes we must read <object> because it will be used in <constellation> -> <instance>.
	//
	// 3. <object>
	for(const CAMFImporter_NodeElement* root_child: root_el->Child)
	{
		if(root_child->Type == CAMFImporter_NodeElement::ENET_Object)
		{
			aiNode* tnode = nullptr;

			// for <object> mesh and node must be built: object ID assigned to aiNode name and will be used in future for <instance>
			Postprocess_BuildNodeAndObject(*((CAMFImporter_NodeElement_Object*)root_child), mesh_list, &tnode);
			if(tnode != nullptr) node_list.push_back(tnode);

		}
	}// for(const CAMFImporter_NodeElement* root_child: root_el->Child)

	// And finally read rest of nodes.
	//
	for(const CAMFImporter_NodeElement* root_child: root_el->Child)
	{
		// 4. <constellation>
		if(root_child->Type == CAMFImporter_NodeElement::ENET_Constellation)
		{
			// <object> and <constellation> at top of self abstraction use aiNode. So we can use only aiNode list for creating new aiNode's.
			Postprocess_BuildConstellation(*((CAMFImporter_NodeElement_Constellation*)root_child), node_list);
		}

		// 5, <metadata>
		if(root_child->Type == CAMFImporter_NodeElement::ENET_Metadata) meta_list.push_back((CAMFImporter_NodeElement_Metadata*)root_child);
	}// for(const CAMFImporter_NodeElement* root_child: root_el->Child)

	// at now we can add collected metadata to root node
	Postprocess_AddMetadata(meta_list, *pScene->mRootNode);
	//
	// Check constellation children
	//
	// As said in specification:
	// "When multiple objects and constellations are defined in a single file, only the top level objects and constellations are available for printing."
	// What that means? For example: if some object is used in constellation then you must show only constellation but not original object.
	// And at this step we are checking that relations.
nl_clean_loop:

	if(node_list.size() > 1)
	{
		// walk through all nodes
		for(std::list<aiNode*>::iterator nl_it = node_list.begin(); nl_it != node_list.end(); ++nl_it)
		{
			// and try to find them in another top nodes.
			std::list<aiNode*>::const_iterator next_it = nl_it;

			++next_it;
			for(; next_it != node_list.end(); ++next_it)
			{
				if((*next_it)->FindNode((*nl_it)->mName) != nullptr)
				{
					// if current top node(nl_it) found in another top node then erase it from node_list and restart search loop.
					node_list.erase(nl_it);

					goto nl_clean_loop;
				}
			}// for(; next_it != node_list.end(); next_it++)
		}// for(std::list<aiNode*>::const_iterator nl_it = node_list.begin(); nl_it != node_list.end(); nl_it++)
	}

	//
	// move created objects to aiScene
	//
	//
	// Nodes
	if(!node_list.empty())
	{
		std::list<aiNode*>::const_iterator nl_it = node_list.begin();

		pScene->mRootNode->mNumChildren = static_cast<unsigned int>(node_list.size());
		pScene->mRootNode->mChildren = new aiNode*[pScene->mRootNode->mNumChildren];
		for(size_t i = 0; i < pScene->mRootNode->mNumChildren; i++)
		{
			// Objects and constellation that must be showed placed at top of hierarchy in <amf> node. So all aiNode's in node_list must have
			// mRootNode only as parent.
			(*nl_it)->mParent = pScene->mRootNode;
			pScene->mRootNode->mChildren[i] = *nl_it++;
		}
	}// if(node_list.size() > 0)

	//
	// Meshes
	if(!mesh_list.empty())
	{
		std::list<aiMesh*>::const_iterator ml_it = mesh_list.begin();

		pScene->mNumMeshes = static_cast<unsigned int>(mesh_list.size());
		pScene->mMeshes = new aiMesh*[pScene->mNumMeshes];
		for(size_t i = 0; i < pScene->mNumMeshes; i++) pScene->mMeshes[i] = *ml_it++;
	}// if(mesh_list.size() > 0)

	//
	// Textures
	pScene->mNumTextures = static_cast<unsigned int>(mTexture_Converted.size());
	if(pScene->mNumTextures > 0)
	{
		size_t idx;

		idx = 0;
		pScene->mTextures = new aiTexture*[pScene->mNumTextures];
		for(const SPP_Texture& tex_convd: mTexture_Converted)
		{
			pScene->mTextures[idx] = new aiTexture;
			pScene->mTextures[idx]->mWidth = static_cast<unsigned int>(tex_convd.Width);
			pScene->mTextures[idx]->mHeight = static_cast<unsigned int>(tex_convd.Height);
			pScene->mTextures[idx]->pcData = (aiTexel*)tex_convd.Data;
			// texture format description.
			strcpy(pScene->mTextures[idx]->achFormatHint, tex_convd.FormatHint);
			idx++;
		}// for(const SPP_Texture& tex_convd: mTexture_Converted)

		// Create materials for embedded textures.
		idx = 0;
		pScene->mNumMaterials = static_cast<unsigned int>(mTexture_Converted.size());
		pScene->mMaterials = new aiMaterial*[pScene->mNumMaterials];
		for(const SPP_Texture& tex_convd: mTexture_Converted)
		{
			const aiString texture_id(AI_EMBEDDED_TEXNAME_PREFIX + to_string(idx));
			const int mode = aiTextureOp_Multiply;
			const int repeat = tex_convd.Tiled ? 1 : 0;

			pScene->mMaterials[idx] = new aiMaterial;
			pScene->mMaterials[idx]->AddProperty(&texture_id, AI_MATKEY_TEXTURE_DIFFUSE(0));
			pScene->mMaterials[idx]->AddProperty(&mode, 1, AI_MATKEY_TEXOP_DIFFUSE(0));
			pScene->mMaterials[idx]->AddProperty(&repeat, 1, AI_MATKEY_MAPPINGMODE_U_DIFFUSE(0));
			pScene->mMaterials[idx]->AddProperty(&repeat, 1, AI_MATKEY_MAPPINGMODE_V_DIFFUSE(0));
			idx++;
		}
	}// if(pScene->mNumTextures > 0)
}